

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool bVar3;
  const_iterator __first;
  const_iterator __last;
  char *pcVar4;
  cmLinkLineComputer *pcVar5;
  cmOutputConverter *local_300;
  allocator local_259;
  string local_258;
  cmStateSnapshot local_238;
  cmStateDirectory local_220;
  auto_ptr<cmLinkLineComputer> local_1f8;
  auto_ptr<cmLinkLineComputer> linkLineComputer;
  string local_1e8;
  string local_1c8;
  allocator local_1a1;
  undefined1 local_1a0 [8];
  string linkFlagsConfig;
  string local_178;
  undefined1 local_158 [8];
  string extraFlags;
  undefined1 local_130 [8];
  string linkRuleVar;
  string linkLanguage;
  string local_e8;
  undefined1 local_c8 [8];
  string extraFlags_1;
  undefined1 local_a0 [8];
  string linkRuleVar_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  undefined1 local_59;
  LinkClosure *pLStack_58;
  bool hasCUDA;
  LinkClosure *closure;
  allocator local_39;
  undefined1 local_38 [8];
  string cuda_lang;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  cuda_lang.field_2._M_local_buf[0xf] = relink;
  bVar3 = cmGeneratorTarget::IsFrameworkOnApple
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (bVar3) {
    WriteFrameworkRules(this,(bool)(cuda_lang.field_2._M_local_buf[0xf] & 1));
  }
  else {
    if ((cuda_lang.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_38,"CUDA",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      pLStack_58 = cmGeneratorTarget::GetLinkClosure
                             ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                              GeneratorTarget,
                              &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator
                               .ConfigName);
      __first = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&pLStack_58->Languages);
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&pLStack_58->Languages);
      local_68 = std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           (__first._M_current,__last._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38);
      linkRuleVar_1.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pLStack_58->Languages);
      local_59 = __gnu_cxx::operator!=
                           (&local_68,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&linkRuleVar_1.field_2 + 8));
      if ((bool)local_59) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_a0,"CMAKE_CUDA_DEVICE_LINK_LIBRARY",
                   (allocator *)(extraFlags_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(extraFlags_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::string((string *)local_c8);
        pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget;
        pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_e8,"LINK_FLAGS",
                   (allocator *)(linkLanguage.field_2._M_local_buf + 0xf));
        pcVar4 = cmGeneratorTarget::GetProperty(pcVar1,&local_e8);
        (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
                  (pcVar2,local_c8,pcVar4);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf));
        WriteDeviceLibraryRules
                  (this,(string *)local_a0,(string *)local_c8,
                   (bool)(cuda_lang.field_2._M_local_buf[0xf] & 1));
        std::__cxx11::string::~string((string *)local_c8);
        std::__cxx11::string::~string((string *)local_a0);
      }
      std::__cxx11::string::~string((string *)local_38);
    }
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)((long)&linkRuleVar.field_2 + 8),
               (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,&(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_130,"CMAKE_",(allocator *)(extraFlags.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(extraFlags.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=
              ((string *)local_130,(string *)(linkRuleVar.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_130,"_CREATE_SHARED_LIBRARY");
    std::__cxx11::string::string((string *)local_158);
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_178,"LINK_FLAGS",
               (allocator *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
    pcVar4 = cmGeneratorTarget::GetProperty(pcVar1,&local_178);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
              (pcVar2,local_158,pcVar4);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator
              ((allocator<char> *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1a0,"LINK_FLAGS_",&local_1a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    cmsys::SystemTools::UpperCase
              (&local_1c8,
               &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    std::__cxx11::string::operator+=((string *)local_1a0,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar4 = cmGeneratorTarget::GetProperty
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget,(string *)local_1a0);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
              (pcVar2,local_158,pcVar4);
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1e8,"CMAKE_SHARED_LINKER_FLAGS",
               (allocator *)((long)&linkLineComputer.x_ + 7));
    cmLocalGenerator::AddConfigVariableFlags
              ((cmLocalGenerator *)pcVar2,(string *)local_158,&local_1e8,
               &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&linkLineComputer.x_ + 7));
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    local_300 = (cmOutputConverter *)0x0;
    if (pcVar2 != (cmLocalUnixMakefileGenerator3 *)0x0) {
      local_300 = &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
    }
    cmLocalGenerator::GetStateSnapshot
              (&local_238,(cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator
              );
    cmStateSnapshot::GetDirectory(&local_220,&local_238);
    pcVar5 = cmMakefileTargetGenerator::CreateLinkLineComputer
                       (&this->super_cmMakefileTargetGenerator,local_300,&local_220);
    ::cm::auto_ptr<cmLinkLineComputer>::auto_ptr(&local_1f8,pcVar5);
    pcVar5 = ::cm::auto_ptr<cmLinkLineComputer>::get(&local_1f8);
    cmCommonTargetGenerator::AddModuleDefinitionFlag
              ((cmCommonTargetGenerator *)this,pcVar5,(string *)local_158);
    pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,"LINK_WHAT_YOU_USE",&local_259);
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    if (bVar3) {
      pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
                (pcVar2,local_158," -Wl,--no-as-needed");
    }
    WriteLibraryRules(this,(string *)local_130,(string *)local_158,
                      (bool)(cuda_lang.field_2._M_local_buf[0xf] & 1));
    ::cm::auto_ptr<cmLinkLineComputer>::~auto_ptr(&local_1f8);
    std::__cxx11::string::~string((string *)local_1a0);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules(bool relink)
{
  if (this->GeneratorTarget->IsFrameworkOnApple()) {
    this->WriteFrameworkRules(relink);
    return;
  }

  if (!relink) {
    const std::string cuda_lang("CUDA");
    cmGeneratorTarget::LinkClosure const* closure =
      this->GeneratorTarget->GetLinkClosure(this->ConfigName);

    const bool hasCUDA =
      (std::find(closure->Languages.begin(), closure->Languages.end(),
                 cuda_lang) != closure->Languages.end());
    if (hasCUDA) {
      std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
      std::string extraFlags;
      this->LocalGenerator->AppendFlags(
        extraFlags, this->GeneratorTarget->GetProperty("LINK_FLAGS"));
      this->WriteDeviceLibraryRules(linkRuleVar, extraFlags, relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_LIBRARY";

  std::string extraFlags;
  this->LocalGenerator->AppendFlags(
    extraFlags, this->GeneratorTarget->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags(
    extraFlags, this->GeneratorTarget->GetProperty(linkFlagsConfig));

  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_SHARED_LINKER_FLAGS", this->ConfigName);

  CM_AUTO_PTR<cmLinkLineComputer> linkLineComputer(
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory()));

  this->AddModuleDefinitionFlag(linkLineComputer.get(), extraFlags);

  if (this->GeneratorTarget->GetPropertyAsBool("LINK_WHAT_YOU_USE")) {
    this->LocalGenerator->AppendFlags(extraFlags, " -Wl,--no-as-needed");
  }
  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}